

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O2

void sort_rec2(int *array,int size)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  
  uVar5 = (ulong)(uint)size;
  while (iVar7 = (int)uVar5, 0xf < iVar7) {
    iVar4 = array[uVar5 >> 1];
    lVar12 = -1;
    while( true ) {
      lVar12 = (long)(int)lVar12;
      piVar11 = array + lVar12;
      do {
        lVar12 = lVar12 + 1;
        iVar1 = piVar11[1];
        piVar11 = piVar11 + 1;
      } while (iVar1 < iVar4);
      uVar5 = (ulong)(int)uVar5;
      do {
        lVar2 = uVar5 - 1;
        uVar5 = uVar5 - 1;
      } while (iVar4 < array[lVar2]);
      if ((long)uVar5 <= lVar12) break;
      *piVar11 = array[lVar2];
      array[uVar5] = iVar1;
    }
    sort_rec2(array,(int)lVar12);
    array = piVar11;
    uVar5 = (ulong)(uint)(iVar7 - (int)lVar12);
  }
  iVar4 = 1;
  if (1 < iVar7) {
    iVar4 = iVar7;
  }
  uVar6 = 1;
  for (uVar8 = 0; uVar8 != iVar4 - 1; uVar8 = uVar8 + 1) {
    uVar10 = uVar8 & 0xffffffff;
    for (uVar9 = uVar6; iVar7 = (int)uVar10, uVar5 != uVar9; uVar9 = uVar9 + 1) {
      uVar3 = uVar9 & 0xffffffff;
      if (array[iVar7] <= array[uVar9]) {
        uVar3 = uVar10;
      }
      uVar10 = uVar3;
    }
    iVar1 = array[uVar8];
    array[uVar8] = array[iVar7];
    array[iVar7] = iVar1;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

static void sort_rec2(int* array, int size)
{
    if (size <= 15)
        selectionsort2(array, size);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec2(array    , i     );
        sort_rec2(&array[i], size-i);
    }
}